

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clockbounds.cc
# Opt level: O2

void __thiscall
tchecker::clockbounds::local_m_map_t::local_m_map_t
          (local_m_map_t *this,loc_id_t loc_nb,clock_id_t clock_nb)

{
  allocator_type local_29;
  value_type local_28;
  
  this->_loc_nb = 0;
  this->_clock_nb = 0;
  local_28 = (value_type)0x0;
  std::
  vector<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
  ::vector(&this->_M,0,&local_28,&local_29);
  resize(this,loc_nb,clock_nb);
  return;
}

Assistant:

local_m_map_t::local_m_map_t(tchecker::loc_id_t loc_nb, tchecker::clock_id_t clock_nb)
    : _loc_nb(0), _clock_nb(0), _M(_loc_nb, nullptr)
{
  resize(loc_nb, clock_nb);
}